

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assign.h
# Opt level: O0

void Eigen::internal::
     assign_impl<Eigen::Matrix<double,_-1,_1,_0,_4,_1>,_Eigen::Matrix<double,_-1,_1,_0,_4,_1>,_3,_0,_0>
     ::run(Matrix<double,__1,_1,_0,_4,_1> *dst,Matrix<double,__1,_1,_0,_4,_1> *src)

{
  Index index_00;
  Matrix<double,__1,_1,_0,_4,_1> *dst_00;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_4,_1>,_1> *in_RSI;
  Matrix<double,__1,_1,_0,_4,_1> *in_RDI;
  Index index;
  Index alignedEnd;
  Index alignedStart;
  Index size;
  Index in_stack_ffffffffffffffc8;
  EigenBase<Eigen::Matrix<double,__1,_1,_0,_4,_1>_> *in_stack_ffffffffffffffd0;
  long start;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,_4,_1>_> *other;
  
  index_00 = EigenBase<Eigen::Matrix<double,_-1,_1,_0,_4,_1>_>::size(in_stack_ffffffffffffffd0);
  other = (DenseBase<Eigen::Matrix<double,__1,_1,_0,_4,_1>_> *)0x0;
  dst_00 = (Matrix<double,__1,_1,_0,_4,_1> *)((index_00 / 2) * 2);
  unaligned_assign_impl<true>::
  run<Eigen::Matrix<double,_1,1,0,4,1>,Eigen::Matrix<double,_1,1,0,4,1>>
            ((Matrix<double,__1,_1,_0,_4,_1> *)in_RSI,in_RDI,0,0);
  for (start = 0; start < (long)dst_00; start = start + 2) {
    DenseCoeffsBase<Eigen::Matrix<double,-1,1,0,4,1>,1>::
    copyPacket<Eigen::Matrix<double,_1,1,0,4,1>,1,1>(in_RSI,index_00,other);
  }
  unaligned_assign_impl<false>::
  run<Eigen::Matrix<double,_1,1,0,4,1>,Eigen::Matrix<double,_1,1,0,4,1>>
            ((Matrix<double,__1,_1,_0,_4,_1> *)other,dst_00,start,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

static EIGEN_STRONG_INLINE void run(Derived1 &dst, const Derived2 &src)
  {
    const Index size = dst.size();
    typedef packet_traits<typename Derived1::Scalar> PacketTraits;
    enum {
      packetSize = PacketTraits::size,
      dstAlignment = PacketTraits::AlignedOnScalar ? Aligned : int(assign_traits<Derived1,Derived2>::DstIsAligned) ,
      srcAlignment = assign_traits<Derived1,Derived2>::JointAlignment
    };
    const Index alignedStart = assign_traits<Derived1,Derived2>::DstIsAligned ? 0
                             : internal::first_aligned(&dst.coeffRef(0), size);
    const Index alignedEnd = alignedStart + ((size-alignedStart)/packetSize)*packetSize;

    unaligned_assign_impl<assign_traits<Derived1,Derived2>::DstIsAligned!=0>::run(src,dst,0,alignedStart);

    for(Index index = alignedStart; index < alignedEnd; index += packetSize)
    {
      dst.template copyPacket<Derived2, dstAlignment, srcAlignment>(index, src);
    }

    unaligned_assign_impl<>::run(src,dst,alignedEnd,size);
  }